

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_write.h
# Opt level: O2

int stbi_write_tga_core(stbi__write_context *s,int x,int y,int comp,void *data)

{
  long lVar1;
  uint rgb_dir;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  void *__s1;
  undefined4 in_register_00000034;
  int iVar8;
  uchar *d;
  void *pvVar9;
  size_t __n;
  long lVar10;
  bool bVar11;
  bool bVar12;
  ulong in_stack_fffffffffffffec0;
  undefined8 in_stack_fffffffffffffed8;
  ulong local_38;
  
  rgb_dir = (uint)((comp - 2U & 0xfffffffd) == 0);
  iVar2 = comp - rgb_dir;
  if ((y | x) < 0) {
    iVar2 = 0;
  }
  else if (stbi_write_tga_with_rle == 0) {
    iVar2 = stbiw__outfile(s,rgb_dir,(int)data,x,y,comp,0,data,rgb_dir,0,"111 221 2222 11",0,0,
                           iVar2 < 2 | 2,0,0,0,0,0,x,y,(iVar2 + rgb_dir) * 8,rgb_dir * 8);
  }
  else {
    d = (uchar *)0x0;
    stbiw__writef(s,(char *)CONCAT44(in_register_00000034,x),0,0,(ulong)(iVar2 < 2 | 10),0,0,
                  in_stack_fffffffffffffec0 & 0xffffffff00000000,0,0,
                  CONCAT44((int)((ulong)in_stack_fffffffffffffed8 >> 0x20),x),y,
                  (iVar2 + rgb_dir) * 8,rgb_dir * 8);
    iVar2 = y + -1;
    bVar11 = stbi__flip_vertically_on_write == 0;
    lVar1 = (ulong)(stbi__flip_vertically_on_write != 0) * 2 + -1;
    if (stbi__flip_vertically_on_write != 0) {
      iVar2 = 0;
    }
    iVar8 = comp * x;
    __n = (size_t)comp;
    iVar3 = iVar2 * iVar8;
    for (lVar5 = (long)iVar2; lVar5 != (int)(-(uint)bVar11 | y); lVar5 = lVar5 + lVar1) {
      iVar2 = iVar8 * (int)lVar5;
      for (iVar7 = 0; iVar7 < x; iVar7 = uVar6 + iVar7) {
        local_38 = 1;
        if (iVar7 < x + -1) {
          __s1 = (void *)((long)data + (long)(iVar7 * comp) + (long)iVar2);
          iVar4 = bcmp(__s1,(void *)((long)data + (long)((iVar7 + 1) * comp) + (long)iVar2),__n);
          lVar10 = (long)(iVar7 + 2);
          if (iVar4 != 0) {
            pvVar9 = (void *)((long)data + __n * lVar10 + (long)iVar3);
            local_38 = 2;
            while( true ) {
              if ((x <= lVar10) || (0x7f < (uint)local_38)) goto LAB_00122338;
              iVar4 = bcmp(__s1,pvVar9,__n);
              if (iVar4 == 0) break;
              __s1 = (void *)((long)__s1 + __n);
              local_38 = (ulong)((uint)local_38 + 1);
              lVar10 = lVar10 + 1;
              pvVar9 = (void *)((long)pvVar9 + __n);
            }
            local_38 = (ulong)((uint)local_38 - 1);
            goto LAB_00122338;
          }
          pvVar9 = (void *)((long)data + __n * lVar10 + (long)iVar3);
          uVar6 = 2;
          while (((lVar10 < x && (uVar6 < 0x80)) && (iVar4 = bcmp(__s1,pvVar9,__n), iVar4 == 0))) {
            uVar6 = uVar6 + 1;
            lVar10 = lVar10 + 1;
            pvVar9 = (void *)((long)pvVar9 + __n);
          }
          stbiw__write1(s,(char)uVar6 + '\x7f');
          stbiw__write_pixel(s,comp,rgb_dir,0,(int)__s1,d);
        }
        else {
LAB_00122338:
          stbiw__write1(s,(char)local_38 + 0xff);
          uVar6 = (uint)local_38;
          lVar10 = (long)data + (long)(iVar7 * comp) + (long)iVar3;
          while (bVar12 = local_38 != 0, local_38 = local_38 - 1, bVar12) {
            stbiw__write_pixel(s,comp,rgb_dir,0,(int)lVar10,d);
            lVar10 = lVar10 + __n;
          }
        }
      }
      iVar3 = (int)lVar1 * iVar8 + iVar3;
    }
    stbiw__write_flush(s);
    iVar2 = 1;
  }
  return iVar2;
}

Assistant:

static int stbi_write_tga_core(stbi__write_context *s, int x, int y, int comp, void *data)
{
   int has_alpha = (comp == 2 || comp == 4);
   int colorbytes = has_alpha ? comp-1 : comp;
   int format = colorbytes < 2 ? 3 : 2; // 3 color channels (RGB/RGBA) = 2, 1 color channel (Y/YA) = 3

   if (y < 0 || x < 0)
      return 0;

   if (!stbi_write_tga_with_rle) {
      return stbiw__outfile(s, -1, -1, x, y, comp, 0, (void *) data, has_alpha, 0,
         "111 221 2222 11", 0, 0, format, 0, 0, 0, 0, 0, x, y, (colorbytes + has_alpha) * 8, has_alpha * 8);
   } else {
      int i,j,k;
      int jend, jdir;

      stbiw__writef(s, "111 221 2222 11", 0,0,format+8, 0,0,0, 0,0,x,y, (colorbytes + has_alpha) * 8, has_alpha * 8);

      if (stbi__flip_vertically_on_write) {
         j = 0;
         jend = y;
         jdir = 1;
      } else {
         j = y-1;
         jend = -1;
         jdir = -1;
      }
      for (; j != jend; j += jdir) {
         unsigned char *row = (unsigned char *) data + j * x * comp;
         int len;

         for (i = 0; i < x; i += len) {
            unsigned char *begin = row + i * comp;
            int diff = 1;
            len = 1;

            if (i < x - 1) {
               ++len;
               diff = memcmp(begin, row + (i + 1) * comp, comp);
               if (diff) {
                  const unsigned char *prev = begin;
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (memcmp(prev, row + k * comp, comp)) {
                        prev += comp;
                        ++len;
                     } else {
                        --len;
                        break;
                     }
                  }
               } else {
                  for (k = i + 2; k < x && len < 128; ++k) {
                     if (!memcmp(begin, row + k * comp, comp)) {
                        ++len;
                     } else {
                        break;
                     }
                  }
               }
            }

            if (diff) {
               unsigned char header = STBIW_UCHAR(len - 1);
               stbiw__write1(s, header);
               for (k = 0; k < len; ++k) {
                  stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin + k * comp);
               }
            } else {
               unsigned char header = STBIW_UCHAR(len - 129);
               stbiw__write1(s, header);
               stbiw__write_pixel(s, -1, comp, has_alpha, 0, begin);
            }
         }
      }
      stbiw__write_flush(s);
   }
   return 1;
}